

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_types.hpp
# Opt level: O3

size_t pstore::serialize::string_helper::read_length<pstore::serialize::archive::database_reader&>
                 (database_reader *archive)

{
  uint uVar1;
  uint64_t uVar2;
  uint size;
  span<unsigned_char,__1L> span;
  span<unsigned_char,__1L> span_00;
  array<unsigned_char,_9UL> encoded_length;
  undefined8 local_40;
  undefined1 local_38;
  extent_type<_1L> local_30 [2];
  
  local_38 = 0;
  local_40 = 0;
  span.storage_.data_ = (pointer)&local_40;
  span.storage_.super_extent_type<_1L>.size_ = 2;
  serialize::archive::database_reader::getn<pstore::gsl::span<unsigned_char,_1l>,void>(archive,span)
  ;
  uVar1 = bit_count::ctz(local_40 & 0xff | 0x100);
  size = uVar1 + 1;
  if (size == 0) {
    assert_failed("varint_length > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                  ,0x54);
  }
  if (2 < size) {
    if (9 < size) {
      assert_failed("varint_length <= encoded_length.size ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/standard_types.hpp"
                    ,0x58);
    }
    gsl::details::extent_type<-1L>::extent_type(local_30,(ulong)(uVar1 - 1));
    span_00.storage_.data_ = (pointer)((long)&local_40 + 2);
    span_00.storage_.super_extent_type<_1L>.size_ = local_30[0].size_;
    serialize::archive::database_reader::getn<pstore::gsl::span<unsigned_char,_1l>,void>
              (archive,span_00);
  }
  uVar2 = varint::decode<unsigned_char*>((uchar *)&local_40,size);
  return uVar2;
}

Assistant:

static std::size_t read_length (Archive && archive) {
                std::array<std::uint8_t, varint::max_output_length> encoded_length{{0}};
                // First read the two initial bytes. These contain the variable length value
                // but might not be enough for the entire value.
                static_assert (varint::max_output_length >= 2,
                               "maximum encoded varint length must be >= 2");
                serialize::read_uninit (archive, gsl::make_span (encoded_length.data (), 2));

                auto const varint_length = varint::decode_size (std::begin (encoded_length));
                PSTORE_ASSERT (varint_length > 0);
                // Was that initial read of 2 bytes enough? If not get the rest of the
                // length value.
                if (varint_length > 2) {
                    PSTORE_ASSERT (varint_length <= encoded_length.size ());
                    serialize::read_uninit (
                        archive, gsl::make_span (encoded_length.data () + 2, varint_length - 2));
                }

                return varint::decode (encoded_length.data (), varint_length);
            }